

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O3

void __thiscall
rlottie::internal::renderer::CompLayer::renderHelper
          (CompLayer *this,VPainter *painter,VRle *inheritMask,VRle *matteRle,SurfaceCache *cache)

{
  int iVar1;
  LayerMask *clipRect;
  model *pmVar2;
  VSize VVar3;
  Clipper *mask_00;
  pointer ppLVar4;
  Layer *pLVar5;
  VSize VVar6;
  pointer ppLVar7;
  CompLayer *this_00;
  CompLayer *layer;
  VRle mask;
  VSize local_60;
  VSize local_58;
  VPath local_50;
  undefined1 local_48 [16];
  VSize local_38;
  
  local_48._8_8_ = local_48._0_8_;
  local_50.d.mModel = (vcow_ptr<VPath::VPathData>)(vcow_ptr<VPath::VPathData>)cache;
  vcow_ptr<VRle::Data>::vcow_ptr((vcow_ptr<VRle::Data> *)&local_60);
  clipRect = (this->super_Layer).mLayerMask._M_t.
             super___uniq_ptr_impl<rlottie::internal::renderer::LayerMask,_std::default_delete<rlottie::internal::renderer::LayerMask>_>
             ._M_t.
             super__Tuple_impl<0UL,_rlottie::internal::renderer::LayerMask_*,_std::default_delete<rlottie::internal::renderer::LayerMask>_>
             .super__Head_base<0UL,_rlottie::internal::renderer::LayerMask_*,_false>._M_head_impl;
  if (clipRect == (LayerMask *)0x0) {
    VVar3 = (VSize)(inheritMask->d).mModel;
    LOCK();
    *(long *)VVar3 = *(long *)VVar3 + 1;
    UNLOCK();
    local_58.mw = 0;
    local_58.mh = 0;
    local_48._0_4_ = local_60.mw;
    local_48._4_4_ = local_60.mh;
    local_60 = VVar3;
    vcow_ptr<VRle::Data>::~vcow_ptr((vcow_ptr<VRle::Data> *)local_48);
    vcow_ptr<VRle::Data>::~vcow_ptr((vcow_ptr<VRle::Data> *)&local_58);
  }
  else {
    local_48 = (undefined1  [16])VPainter::clipBoundingRect(painter);
    LayerMask::maskRle((LayerMask *)&local_38,(VRect *)clipRect);
    VVar3 = local_38;
    local_58 = local_60;
    local_38.mw = 0;
    local_38.mh = 0;
    local_60 = VVar3;
    vcow_ptr<VRle::Data>::~vcow_ptr((vcow_ptr<VRle::Data> *)&local_58);
    vcow_ptr<VRle::Data>::~vcow_ptr((vcow_ptr<VRle::Data> *)&local_38);
    pmVar2 = (inheritMask->d).mModel;
    if ((pmVar2->mValue).mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pmVar2->mValue).mSpans.super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      VRle::operator&((VRle *)&local_58,(VRle *)&local_60);
      VVar6 = local_58;
      VVar3 = local_60;
      local_58.mw = 0;
      local_58.mh = 0;
      local_60 = VVar6;
      VVar6 = local_60;
      local_60.mw = VVar3.mw;
      local_60.mh = VVar3.mh;
      local_48._0_4_ = local_60.mw;
      local_48._4_4_ = local_60.mh;
      local_60 = VVar6;
      vcow_ptr<VRle::Data>::~vcow_ptr((vcow_ptr<VRle::Data> *)local_48);
      vcow_ptr<VRle::Data>::~vcow_ptr((vcow_ptr<VRle::Data> *)&local_58);
    }
    if ((((Data *)((long)local_60 + 8))->mSpans).
        super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.super__Vector_impl_data.
        _M_start == *(pointer *)((long)local_60 + 0x10)) goto LAB_00128ded;
  }
  mask_00 = (this->mClipper)._M_t.
            super___uniq_ptr_impl<rlottie::internal::renderer::Clipper,_std::default_delete<rlottie::internal::renderer::Clipper>_>
            ._M_t.
            super__Tuple_impl<0UL,_rlottie::internal::renderer::Clipper_*,_std::default_delete<rlottie::internal::renderer::Clipper>_>
            .super__Head_base<0UL,_rlottie::internal::renderer::Clipper_*,_false>._M_head_impl;
  if (mask_00 != (Clipper *)0x0) {
    Clipper::rle((Clipper *)&local_58,(VRle *)mask_00);
    VVar6 = local_58;
    VVar3 = local_60;
    local_58.mw = 0;
    local_58.mh = 0;
    local_60 = VVar6;
    VVar6 = local_60;
    local_60.mw = VVar3.mw;
    local_60.mh = VVar3.mh;
    local_48._0_4_ = local_60.mw;
    local_48._4_4_ = local_60.mh;
    local_60 = VVar6;
    vcow_ptr<VRle::Data>::~vcow_ptr((vcow_ptr<VRle::Data> *)local_48);
    vcow_ptr<VRle::Data>::~vcow_ptr((vcow_ptr<VRle::Data> *)&local_58);
    if ((((Data *)((long)local_60 + 8))->mSpans).
        super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.super__Vector_impl_data.
        _M_start == *(pointer *)((long)local_60 + 0x10)) goto LAB_00128ded;
  }
  ppLVar7 = (this->mLayers).
            super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppLVar4 = (this->mLayers).
            super__Vector_base<rlottie::internal::renderer::Layer_*,_std::allocator<rlottie::internal::renderer::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar7 != ppLVar4) {
    layer = (CompLayer *)0x0;
    do {
      this_00 = (CompLayer *)*ppLVar7;
      pLVar5 = (this_00->super_Layer).mLayerData;
      if (pLVar5->mMatteType == None) {
        iVar1 = (this_00->super_Layer).mFrameNo;
        if ((pLVar5->mInFrame <= iVar1) && (iVar1 <= pLVar5->mOutFrame)) {
          if (layer == (CompLayer *)0x0) {
            (*(this_00->super_Layer)._vptr_Layer[4])
                      (this_00,painter,&local_60,matteRle,local_50.d.mModel);
          }
          else {
            iVar1 = (layer->super_Layer).mFrameNo;
            pLVar5 = (layer->super_Layer).mLayerData;
            if ((pLVar5->mInFrame <= iVar1) && (iVar1 <= pLVar5->mOutFrame)) {
              renderMatteLayer(this_00,painter,(VRle *)&local_60,matteRle,&layer->super_Layer,
                               (Layer *)this_00,(SurfaceCache *)local_50.d.mModel);
            }
          }
        }
        this_00 = (CompLayer *)0x0;
      }
      ppLVar7 = ppLVar7 + 1;
      layer = this_00;
    } while (ppLVar7 != ppLVar4);
  }
LAB_00128ded:
  vcow_ptr<VRle::Data>::~vcow_ptr((vcow_ptr<VRle::Data> *)&local_60);
  return;
}

Assistant:

void renderer::CompLayer::renderHelper(VPainter *    painter,
                                       const VRle &  inheritMask,
                                       const VRle &  matteRle,
                                       SurfaceCache &cache)
{
    VRle mask;
    if (mLayerMask) {
        mask = mLayerMask->maskRle(painter->clipBoundingRect());
        if (!inheritMask.empty()) mask = mask & inheritMask;
        // if resulting mask is empty then return.
        if (mask.empty()) return;
    } else {
        mask = inheritMask;
    }

    if (mClipper) {
        mask = mClipper->rle(mask);
        if (mask.empty()) return;
    }

    renderer::Layer *matte = nullptr;
    for (const auto &layer : mLayers) {
        if (layer->hasMatte()) {
            matte = layer;
        } else {
            if (layer->visible()) {
                if (matte) {
                    if (matte->visible())
                        renderMatteLayer(painter, mask, matteRle, matte, layer,
                                         cache);
                } else {
                    layer->render(painter, mask, matteRle, cache);
                }
            }
            matte = nullptr;
        }
    }
}